

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

MemoryRegionSection *
address_space_translate_for_iotlb_x86_64
          (CPUState *cpu,int asidx,hwaddr addr,hwaddr *xlat,hwaddr *plen,MemTxAttrs attrs,int *prot)

{
  _Bool _Var1;
  MemoryRegionSection *pMVar2;
  IOMMUMemoryRegion *pIVar3;
  FlatView *fv;
  MemTxAttrs in_stack_ffffffffffffff48;
  AddressSpaceDispatch *local_90;
  AddressSpaceDispatch *d;
  AddressSpace *pAStack_80;
  int iommu_idx;
  IOMMUTLBEntry iotlb;
  IOMMUMemoryRegionClass *imrc;
  IOMMUMemoryRegion *iommu_mr;
  MemoryRegionSection *section;
  hwaddr *plen_local;
  hwaddr *xlat_local;
  hwaddr addr_local;
  CPUState *pCStack_20;
  int asidx_local;
  CPUState *cpu_local;
  MemTxAttrs attrs_local;
  
  local_90 = cpu->cpu_ases[asidx].memory_dispatch;
  xlat_local = (hwaddr *)addr;
  addr_local._4_4_ = asidx;
  pCStack_20 = cpu;
  cpu_local._4_4_ = attrs;
  while( true ) {
    pMVar2 = address_space_translate_internal
                       (local_90,(hwaddr)xlat_local,(hwaddr *)&xlat_local,plen,false);
    pIVar3 = memory_region_get_iommu(pMVar2->mr);
    if (pIVar3 == (IOMMUMemoryRegion *)0x0) {
      pIVar3 = memory_region_get_iommu(pMVar2->mr);
      if (pIVar3 == (IOMMUMemoryRegion *)0x0) {
        *xlat = (hwaddr)xlat_local;
        _Var1 = memory_region_is_ram(pMVar2->mr);
        if ((!_Var1) && (pMVar2 == (local_90->map).sections)) {
          *prot = 0;
        }
        return pMVar2;
      }
      __assert_fail("!(memory_region_get_iommu(section->mr) != NULL)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x21b,
                    "MemoryRegionSection *address_space_translate_for_iotlb_x86_64(CPUState *, int, hwaddr, hwaddr *, hwaddr *, MemTxAttrs, int *)"
                   );
    }
    iotlb._32_8_ = memory_region_get_iommu_class_nocheck(pIVar3);
    (*((IOMMUMemoryRegionClass *)iotlb._32_8_)->attrs_to_index)(pIVar3,in_stack_ffffffffffffff48);
    (**(code **)iotlb._32_8_)(&stack0xffffffffffffff48,pIVar3,xlat_local,0);
    memcpy(&stack0xffffffffffffff80,&stack0xffffffffffffff48,0x28);
    xlat_local = (hwaddr *)
                 (iotlb.iova & (iotlb.translated_addr ^ 0xffffffffffffffff) |
                 (ulong)xlat_local & iotlb.translated_addr);
    if (((uint)iotlb.addr_mask & 1) == 0) {
      *prot = *prot & 0xfffffffa;
    }
    if (((uint)iotlb.addr_mask & 2) == 0) {
      *prot = *prot & 0xfffffffd;
    }
    if (*prot == 0) break;
    fv = address_space_to_flatview(pAStack_80);
    local_90 = flatview_to_dispatch(fv);
  }
  return (local_90->map).sections;
}

Assistant:

MemoryRegionSection *
address_space_translate_for_iotlb(CPUState *cpu, int asidx, hwaddr addr,
                                  hwaddr *xlat, hwaddr *plen,
                                  MemTxAttrs attrs, int *prot)
{
    MemoryRegionSection *section;
    IOMMUMemoryRegion *iommu_mr;
    IOMMUMemoryRegionClass *imrc;
    IOMMUTLBEntry iotlb;
    int iommu_idx;
    AddressSpaceDispatch *d = cpu->cpu_ases[asidx].memory_dispatch;

    for (;;) {
        section = address_space_translate_internal(d, addr, &addr, plen, false);

        iommu_mr = memory_region_get_iommu(section->mr);
        if (!iommu_mr) {
            break;
        }

        imrc = memory_region_get_iommu_class_nocheck(iommu_mr);

        iommu_idx = imrc->attrs_to_index(iommu_mr, attrs);

        // tcg_register_iommu_notifier(cpu, iommu_mr, iommu_idx);

        /* We need all the permissions, so pass IOMMU_NONE so the IOMMU
         * doesn't short-cut its translation table walk.
         */
        iotlb = imrc->translate(iommu_mr, addr, IOMMU_NONE, iommu_idx);
        addr = ((iotlb.translated_addr & ~iotlb.addr_mask)
                | (addr & iotlb.addr_mask));
        /* Update the caller's prot bits to remove permissions the IOMMU
         * is giving us a failure response for. If we get down to no
         * permissions left at all we can give up now.
         */
        if (!(iotlb.perm & IOMMU_RO)) {
            *prot &= ~(PAGE_READ | PAGE_EXEC);
        }
        if (!(iotlb.perm & IOMMU_WO)) {
            *prot &= ~PAGE_WRITE;
        }

        if (!*prot) {
            goto translate_fail;
        }

        d = flatview_to_dispatch(address_space_to_flatview(iotlb.target_as));
    }

    assert(!(memory_region_get_iommu(section->mr) != NULL));
    *xlat = addr;
    // Unicorn:
    //   If there is no memory mapped but still we start emulation, we will get
    //   a default memory region section and it would be marked as an IO memory
    //   in cputlb which prevents further fecthing and execution.
    //
    //   The reason we set prot to 0 here is not to setting protection but to notify
    //   the outer function to add a new **blank** tlb which will never be hitted.
    if (!memory_region_is_ram(section->mr) && section == &d->map.sections[PHYS_SECTION_UNASSIGNED]) {
        *prot = 0;
    }
    return section;

translate_fail:
    return &d->map.sections[PHYS_SECTION_UNASSIGNED];
}